

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Material::Material(Material *this,Material *other)

{
  ai_real aVar1;
  Material *other_local;
  Material *this_local;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_00f3fd38;
  std::__cxx11::string::string((string *)&this->mName,(string *)&other->mName);
  aiColor3D::aiColor3D(&this->mDiffuse,&other->mDiffuse);
  aVar1 = other->mShininessStrength;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = aVar1;
  aiColor3D::aiColor3D(&this->mSpecular,&other->mSpecular);
  aiColor3D::aiColor3D(&this->mAmbient,&other->mAmbient);
  aVar1 = other->mTransparency;
  this->mShading = other->mShading;
  this->mTransparency = aVar1;
  Texture::Texture(&this->sTexDiffuse,&other->sTexDiffuse);
  Texture::Texture(&this->sTexOpacity,&other->sTexOpacity);
  Texture::Texture(&this->sTexSpecular,&other->sTexSpecular);
  Texture::Texture(&this->sTexReflective,&other->sTexReflective);
  Texture::Texture(&this->sTexBump,&other->sTexBump);
  Texture::Texture(&this->sTexEmissive,&other->sTexEmissive);
  Texture::Texture(&this->sTexShininess,&other->sTexShininess);
  this->mBumpHeight = other->mBumpHeight;
  aiColor3D::aiColor3D(&this->mEmissive,&other->mEmissive);
  Texture::Texture(&this->sTexAmbient,&other->sTexAmbient);
  this->mTwoSided = (bool)(other->mTwoSided & 1);
  return;
}

Assistant:

Material(const Material &other)            = default;